

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O1

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> __thiscall
qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
          (pl *this,unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link,
          action_e *args)

{
  __uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true> next;
  Link *pLVar1;
  Pl_Flate *this_00;
  undefined8 *puVar2;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_30;
  
  next.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
  super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
  super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
       (((link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
         _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl)->next_pl)._M_t.
       super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>;
  this_00 = (Pl_Flate *)operator_new(0x38);
  Pl_Flate::Pl_Flate(this_00,"",
                     (Pipeline *)
                     next.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
                     super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
                     super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl,*args,0x10000);
  puVar2 = (undefined8 *)operator_new(0x10);
  pLVar1 = (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
           _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
  *puVar2 = pLVar1;
  local_30._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
       (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
  puVar2[1] = this_00;
  *(undefined8 **)this = puVar2;
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_30);
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Link>
    create(std::unique_ptr<Link> link, Args&&... args)
    {
        auto* next = link->next_pl.get();
        return std::make_unique<Link>(
            std::move(link), std::make_unique<P>("", next, std::forward<Args>(args)...));
    }